

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O0

void __thiscall If_IfElseif_Test::TestBody(If_IfElseif_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper local_8c0;
  Message local_8b8;
  int local_8b0;
  uint8_t local_8a9;
  undefined1 local_8a8 [8];
  AssertionResult gtest_ar_27;
  Message local_890;
  int local_888;
  uint8_t local_881;
  undefined1 local_880 [8];
  AssertionResult gtest_ar_26;
  Message local_868;
  int local_860;
  uint8_t local_859;
  undefined1 local_858 [8];
  AssertionResult gtest_ar_25;
  Message local_840;
  BcOp local_838;
  BcOp local_834;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_24;
  undefined1 local_818 [4];
  BcIns ins_9;
  AssertHelper local_7f8;
  Message local_7f0;
  bool local_7e1;
  undefined1 local_7e0 [8];
  AssertionResult gtest_ar__9;
  Message local_7c8;
  int local_7c0;
  uint16_t local_7ba;
  undefined1 local_7b8 [8];
  AssertionResult gtest_ar_23;
  Message local_7a0;
  int local_798;
  uint8_t local_791;
  undefined1 local_790 [8];
  AssertionResult gtest_ar_22;
  Message local_778;
  BcOp local_770;
  BcOp local_76c;
  undefined1 local_768 [8];
  AssertionResult gtest_ar_21;
  undefined1 local_750 [4];
  BcIns ins_8;
  AssertHelper local_730;
  Message local_728;
  bool local_719;
  undefined1 local_718 [8];
  AssertionResult gtest_ar__8;
  Message local_700;
  int local_6f8;
  uint16_t local_6f2;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_20;
  Message local_6d8;
  int local_6d0;
  uint8_t local_6c9;
  undefined1 local_6c8 [8];
  AssertionResult gtest_ar_19;
  Message local_6b0;
  BcOp local_6a8;
  BcOp local_6a4;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar_18;
  undefined1 local_688 [4];
  BcIns ins_7;
  AssertHelper local_668;
  Message local_660;
  bool local_651;
  undefined1 local_650 [8];
  AssertionResult gtest_ar__7;
  Message local_638;
  int local_630;
  uint32_t local_62c;
  undefined1 local_628 [8];
  AssertionResult gtest_ar_17;
  Message local_610;
  BcOp local_608;
  BcOp local_604;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_16;
  undefined1 local_5e8 [4];
  BcIns ins_6;
  AssertHelper local_5c8;
  Message local_5c0;
  bool local_5b1;
  undefined1 local_5b0 [8];
  AssertionResult gtest_ar__6;
  Message local_598;
  int local_590;
  uint16_t local_58a;
  undefined1 local_588 [8];
  AssertionResult gtest_ar_15;
  Message local_570;
  int local_568;
  uint8_t local_561;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_14;
  Message local_548;
  BcOp local_540;
  BcOp local_53c;
  undefined1 local_538 [8];
  AssertionResult gtest_ar_13;
  undefined1 local_520 [4];
  BcIns ins_5;
  AssertHelper local_500;
  Message local_4f8;
  bool local_4e9;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar__5;
  Message local_4d0;
  int local_4c8;
  uint32_t local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_12;
  Message local_4a8;
  BcOp local_4a0;
  BcOp local_49c;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_11;
  undefined1 local_480 [4];
  BcIns ins_4;
  AssertHelper local_460;
  Message local_458;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__4;
  Message local_430;
  int local_428;
  uint16_t local_422;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_10;
  Message local_408;
  int local_400;
  uint8_t local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_9;
  Message local_3e0;
  BcOp local_3d8;
  BcOp local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_8;
  undefined1 local_3b8 [4];
  BcIns ins_3;
  AssertHelper local_398;
  Message local_390;
  bool local_381;
  undefined1 local_380 [8];
  AssertionResult gtest_ar__3;
  Message local_368;
  int local_360;
  uint32_t local_35c;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_7;
  Message local_340;
  BcOp local_338;
  BcOp local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_318 [4];
  BcIns ins_2;
  AssertHelper local_2f8;
  Message local_2f0;
  bool local_2e1;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar__2;
  Message local_2c8;
  int local_2c0;
  uint16_t local_2ba;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_5;
  Message local_2a0;
  int local_298;
  uint8_t local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  BcOp local_270;
  BcOp local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_250 [4];
  BcIns ins_1;
  AssertHelper local_230;
  Message local_228;
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__1;
  Message local_200;
  int local_1f8;
  uint16_t local_1f2;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  int local_1d0;
  uint8_t local_1c9;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  BcOp local_1a8;
  BcOp local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  BcIns ins;
  AssertHelper local_168;
  Message local_160 [3];
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  MockParser mock;
  If_IfElseif_Test *this_local;
  
  MockParser::MockParser
            ((MockParser *)&gtest_ar_.message_,
             "let a = 3\nif a == 3 {\n  let b = 4\n} elseif a == 4 {\n  let b = 5\n}\nlet c = 6\n");
  local_141 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&ins,(internal *)local_140,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x2c5,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&ins);
    testing::Message::~Message(local_160);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    gtest_ar.message_.ptr_._0_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
    local_1a4 = bc_op((BcIns)gtest_ar.message_.ptr_);
    local_1a8 = BC_SET_N;
    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
              ((EqHelper<false> *)local_1a0,"bc_op(ins)","BC_SET_N",&local_1a4,&local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x2c5,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1b0);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_1c9 = bc_arg1((BcIns)gtest_ar.message_.ptr_);
      local_1d0 = 0;
      testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                ((EqHelper<false> *)local_1c8,"bc_arg1(ins)","0",&local_1c9,&local_1d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
      if (!bVar1) {
        testing::Message::Message(&local_1d8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x2c5,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1d8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        local_1f2 = bc_arg16((BcIns)gtest_ar.message_.ptr_);
        local_1f8 = 0;
        testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                  ((EqHelper<false> *)local_1f0,"bc_arg16(ins)","0",&local_1f2,&local_1f8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
        if (!bVar1) {
          testing::Message::Message(&local_200);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x2c5,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar__1.message_,&local_200);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
          testing::Message::~Message(&local_200);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_219 = mock.cur_fn <
                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_218,&local_219,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
          if (!bVar1) {
            testing::Message::Message(&local_228);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_250,(internal *)local_218,
                       (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                       "false","true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_230,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x2c7,pcVar2);
            testing::internal::AssertHelper::operator=(&local_230,&local_228);
            testing::internal::AssertHelper::~AssertHelper(&local_230);
            std::__cxx11::string::~string((string *)local_250);
            testing::Message::~Message(&local_228);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            gtest_ar_3.message_.ptr_._4_4_ = MockParser::next((MockParser *)&gtest_ar_.message_);
            local_26c = bc_op(gtest_ar_3.message_.ptr_._4_4_);
            local_270 = BC_NEQ_LN;
            testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                      ((EqHelper<false> *)local_268,"bc_op(ins)","BC_NEQ_LN",&local_26c,&local_270);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
            if (!bVar1) {
              testing::Message::Message(&local_278);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                         ,0x2c7,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_4.message_,&local_278);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_278);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              local_291 = bc_arg1(gtest_ar_3.message_.ptr_._4_4_);
              local_298 = 0;
              testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                        ((EqHelper<false> *)local_290,"bc_arg1(ins)","0",&local_291,&local_298);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
              if (!bVar1) {
                testing::Message::Message(&local_2a0);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x2c7,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_5.message_,&local_2a0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_)
                ;
                testing::Message::~Message(&local_2a0);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                local_2ba = bc_arg16(gtest_ar_3.message_.ptr_._4_4_);
                local_2c0 = 0;
                testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                          ((EqHelper<false> *)local_2b8,"bc_arg16(ins)","0",&local_2ba,&local_2c0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2b8);
                if (!bVar1) {
                  testing::Message::Message(&local_2c8);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x2c7,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar__2.message_,&local_2c8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar__2.message_);
                  testing::Message::~Message(&local_2c8);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  local_2e1 = mock.cur_fn <
                              (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                  testing::AssertionResult::AssertionResult<bool>
                            ((AssertionResult *)local_2e0,&local_2e1,(type *)0x0);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2e0);
                  if (!bVar1) {
                    testing::Message::Message(&local_2f0);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_318,(internal *)local_2e0,
                               (AssertionResult *)
                               "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true",
                               in_R9);
                    pcVar2 = (char *)std::__cxx11::string::c_str();
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2f8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x2c8,pcVar2);
                    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
                    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
                    std::__cxx11::string::~string((string *)local_318);
                    testing::Message::~Message(&local_2f0);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    gtest_ar_6.message_.ptr_._4_4_ =
                         MockParser::next((MockParser *)&gtest_ar_.message_);
                    local_334 = bc_op(gtest_ar_6.message_.ptr_._4_4_);
                    local_338 = BC_JMP;
                    testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                              ((EqHelper<false> *)local_330,"bc_op(ins)","BC_JMP",&local_334,
                               &local_338);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_330);
                    if (!bVar1) {
                      testing::Message::Message(&local_340);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_330);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                 ,0x2c8,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_7.message_,&local_340);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_7.message_);
                      testing::Message::~Message(&local_340);
                    }
                    gtest_ar.message_.ptr_._5_3_ = 0;
                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                      local_35c = bc_arg24(gtest_ar_6.message_.ptr_._4_4_);
                      local_360 = 0x800002;
                      testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                                ((EqHelper<false> *)local_358,"bc_arg24(ins)","0x800000 + 3 - 1",
                                 &local_35c,&local_360);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_358);
                      if (!bVar1) {
                        testing::Message::Message(&local_368);
                        pcVar2 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_358);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar__3.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x2c8,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar__3.message_,&local_368);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar__3.message_);
                        testing::Message::~Message(&local_368);
                      }
                      gtest_ar.message_.ptr_._5_3_ = 0;
                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                        local_381 = mock.cur_fn <
                                    (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                         mock.vm._264_8_ * 0x18);
                        testing::AssertionResult::AssertionResult<bool>
                                  ((AssertionResult *)local_380,&local_381,(type *)0x0);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_380);
                        if (!bVar1) {
                          testing::Message::Message(&local_390);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_3b8,(internal *)local_380,
                                     (AssertionResult *)
                                     "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                                     "true",in_R9);
                          pcVar2 = (char *)std::__cxx11::string::c_str();
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_398,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x2c9,pcVar2);
                          testing::internal::AssertHelper::operator=(&local_398,&local_390);
                          testing::internal::AssertHelper::~AssertHelper(&local_398);
                          std::__cxx11::string::~string((string *)local_3b8);
                          testing::Message::~Message(&local_390);
                        }
                        gtest_ar.message_.ptr_._5_3_ = 0;
                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                          gtest_ar_8.message_.ptr_._4_4_ =
                               MockParser::next((MockParser *)&gtest_ar_.message_);
                          local_3d4 = bc_op(gtest_ar_8.message_.ptr_._4_4_);
                          local_3d8 = BC_SET_N;
                          testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                    ((EqHelper<false> *)local_3d0,"bc_op(ins)","BC_SET_N",&local_3d4
                                     ,&local_3d8);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3d0);
                          if (!bVar1) {
                            testing::Message::Message(&local_3e0);
                            pcVar2 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_3d0);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                       ,0x2c9,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_9.message_,&local_3e0);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_9.message_);
                            testing::Message::~Message(&local_3e0);
                          }
                          gtest_ar.message_.ptr_._5_3_ = 0;
                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                            local_3f9 = bc_arg1(gtest_ar_8.message_.ptr_._4_4_);
                            local_400 = 1;
                            testing::internal::EqHelper<false>::Compare<unsigned_char,int>
                                      ((EqHelper<false> *)local_3f8,"bc_arg1(ins)","1",&local_3f9,
                                       &local_400);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3f8);
                            if (!bVar1) {
                              testing::Message::Message(&local_408);
                              pcVar2 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_3f8);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x2c9,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_10.message_,&local_408);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_10.message_);
                              testing::Message::~Message(&local_408);
                            }
                            gtest_ar.message_.ptr_._5_3_ = 0;
                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8)
                            ;
                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                              local_422 = bc_arg16(gtest_ar_8.message_.ptr_._4_4_);
                              local_428 = 1;
                              testing::internal::EqHelper<false>::Compare<unsigned_short,int>
                                        ((EqHelper<false> *)local_420,"bc_arg16(ins)","1",&local_422
                                         ,&local_428);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_420);
                              if (!bVar1) {
                                testing::Message::Message(&local_430);
                                pcVar2 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_420);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar__4.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x2c9,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar__4.message_,&local_430);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar__4.message_);
                                testing::Message::~Message(&local_430);
                              }
                              gtest_ar.message_.ptr_._5_3_ = 0;
                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_420);
                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                local_449 = mock.cur_fn <
                                            (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                 mock.vm._264_8_ * 0x18);
                                testing::AssertionResult::AssertionResult<bool>
                                          ((AssertionResult *)local_448,&local_449,(type *)0x0);
                                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_448);
                                if (!bVar1) {
                                  testing::Message::Message(&local_458);
                                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                            ((string *)local_480,(internal *)local_448,
                                             (AssertionResult *)
                                             "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                                             "false","true",in_R9);
                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_460,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                             ,0x2ca,pcVar2);
                                  testing::internal::AssertHelper::operator=(&local_460,&local_458);
                                  testing::internal::AssertHelper::~AssertHelper(&local_460);
                                  std::__cxx11::string::~string((string *)local_480);
                                  testing::Message::~Message(&local_458);
                                }
                                gtest_ar.message_.ptr_._5_3_ = 0;
                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_448);
                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                  gtest_ar_11.message_.ptr_._4_4_ =
                                       MockParser::next((MockParser *)&gtest_ar_.message_);
                                  local_49c = bc_op(gtest_ar_11.message_.ptr_._4_4_);
                                  local_4a0 = BC_JMP;
                                  testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                            ((EqHelper<false> *)local_498,"bc_op(ins)","BC_JMP",
                                             &local_49c,&local_4a0);
                                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_498);
                                  if (!bVar1) {
                                    testing::Message::Message(&local_4a8);
                                    pcVar2 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_498);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x2ca,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_12.message_,&local_4a8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_12.message_);
                                    testing::Message::~Message(&local_4a8);
                                  }
                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_498);
                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                    local_4c4 = bc_arg24(gtest_ar_11.message_.ptr_._4_4_);
                                    local_4c8 = 0x800003;
                                    testing::internal::EqHelper<false>::Compare<unsigned_int,int>
                                              ((EqHelper<false> *)local_4c0,"bc_arg24(ins)",
                                               "0x800000 + 4 - 1",&local_4c4,&local_4c8);
                                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_4c0);
                                    if (!bVar1) {
                                      testing::Message::Message(&local_4d0);
                                      pcVar2 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_4c0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar__5.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x2ca,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar__5.message_,&local_4d0);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar__5.message_);
                                      testing::Message::~Message(&local_4d0);
                                    }
                                    gtest_ar.message_.ptr_._5_3_ = 0;
                                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_4c0);
                                    if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                      local_4e9 = mock.cur_fn <
                                                  (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                       mock.vm._264_8_ * 0x18);
                                      testing::AssertionResult::AssertionResult<bool>
                                                ((AssertionResult *)local_4e8,&local_4e9,(type *)0x0
                                                );
                                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_4e8);
                                      if (!bVar1) {
                                        testing::Message::Message(&local_4f8);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)local_520,(internal *)local_4e8,
                                                   (AssertionResult *)
                                                                                                      
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                        pcVar2 = (char *)std::__cxx11::string::c_str();
                                        testing::internal::AssertHelper::AssertHelper
                                                  (&local_500,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cb,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  (&local_500,&local_4f8);
                                        testing::internal::AssertHelper::~AssertHelper(&local_500);
                                        std::__cxx11::string::~string((string *)local_520);
                                        testing::Message::~Message(&local_4f8);
                                      }
                                      gtest_ar.message_.ptr_._5_3_ = 0;
                                      gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_4e8);
                                      if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                        gtest_ar_13.message_.ptr_._4_4_ =
                                             MockParser::next((MockParser *)&gtest_ar_.message_);
                                        local_53c = bc_op(gtest_ar_13.message_.ptr_._4_4_);
                                        local_540 = BC_NEQ_LN;
                                        testing::internal::EqHelper<false>::Compare<BcOp,BcOp>
                                                  ((EqHelper<false> *)local_538,"bc_op(ins)",
                                                   "BC_NEQ_LN",&local_53c,&local_540);
                                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_538);
                                        if (!bVar1) {
                                          testing::Message::Message(&local_548);
                                          pcVar2 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_538);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_14.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cb,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_14.message_,
                                                     &local_548);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_14.message_);
                                          testing::Message::~Message(&local_548);
                                        }
                                        gtest_ar.message_.ptr_._5_3_ = 0;
                                        gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_538);
                                        if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                          local_561 = bc_arg1(gtest_ar_13.message_.ptr_._4_4_);
                                          local_568 = 0;
                                          testing::internal::EqHelper<false>::
                                          Compare<unsigned_char,int>
                                                    ((EqHelper<false> *)local_560,"bc_arg1(ins)","0"
                                                     ,&local_561,&local_568);
                                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_560);
                                          if (!bVar1) {
                                            testing::Message::Message(&local_570);
                                            pcVar2 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_560);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_15.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cb,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_15.message_,
                                                       &local_570);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_15.message_);
                                            testing::Message::~Message(&local_570);
                                          }
                                          gtest_ar.message_.ptr_._5_3_ = 0;
                                          gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_560);
                                          if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                            local_58a = bc_arg16(gtest_ar_13.message_.ptr_._4_4_);
                                            local_590 = 1;
                                            testing::internal::EqHelper<false>::
                                            Compare<unsigned_short,int>
                                                      ((EqHelper<false> *)local_588,"bc_arg16(ins)",
                                                       "1",&local_58a,&local_590);
                                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_588);
                                            if (!bVar1) {
                                              testing::Message::Message(&local_598);
                                              pcVar2 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_588);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar__6.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cb,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar__6.message_,
                                                         &local_598);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar__6.message_);
                                              testing::Message::~Message(&local_598);
                                            }
                                            gtest_ar.message_.ptr_._5_3_ = 0;
                                            gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_588);
                                            if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                              local_5b1 = mock.cur_fn <
                                                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10
                                                                               + mock.vm._264_8_ *
                                                                                 0x18);
                                              testing::AssertionResult::AssertionResult<bool>
                                                        ((AssertionResult *)local_5b0,&local_5b1,
                                                         (type *)0x0);
                                              bVar1 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_5b0);
                                              if (!bVar1) {
                                                testing::Message::Message(&local_5c0);
                                                testing::internal::
                                                GetBoolAssertionFailureMessage_abi_cxx11_
                                                          ((string *)local_5e8,(internal *)local_5b0
                                                           ,(AssertionResult *)
                                                                                                                        
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                pcVar2 = (char *)std::__cxx11::string::c_str();
                                                testing::internal::AssertHelper::AssertHelper
                                                          (&local_5c8,kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cc,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          (&local_5c8,&local_5c0);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          (&local_5c8);
                                                std::__cxx11::string::~string((string *)local_5e8);
                                                testing::Message::~Message(&local_5c0);
                                              }
                                              gtest_ar.message_.ptr_._5_3_ = 0;
                                              gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_5b0);
                                              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                gtest_ar_16.message_.ptr_._4_4_ =
                                                     MockParser::next((MockParser *)
                                                                      &gtest_ar_.message_);
                                                local_604 = bc_op(gtest_ar_16.message_.ptr_._4_4_);
                                                local_608 = BC_JMP;
                                                testing::internal::EqHelper<false>::
                                                Compare<BcOp,BcOp>((EqHelper<false> *)local_600,
                                                                   "bc_op(ins)","BC_JMP",&local_604,
                                                                   &local_608);
                                                bVar1 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_600);
                                                if (!bVar1) {
                                                  testing::Message::Message(&local_610);
                                                  pcVar2 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_600);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_17.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cc,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_17.message_,
                                                             &local_610);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_17.message_);
                                                  testing::Message::~Message(&local_610);
                                                }
                                                gtest_ar.message_.ptr_._5_3_ = 0;
                                                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_600);
                                                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                  local_62c = bc_arg24(gtest_ar_16.message_.ptr_.
                                                                       _4_4_);
                                                  local_630 = 0x800001;
                                                  testing::internal::EqHelper<false>::
                                                  Compare<unsigned_int,int>
                                                            ((EqHelper<false> *)local_628,
                                                             "bc_arg24(ins)","0x800000 + 2 - 1",
                                                             &local_62c,&local_630);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_628);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_638);
                                                    pcVar2 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_628);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar__7.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cc,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__7.message_,
                                                             &local_638);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__7.message_);
                                                  testing::Message::~Message(&local_638);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_628);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_651 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_650,&local_651
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_650);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_660);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_688,
                                                               (internal *)local_650,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_668,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cd,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_668,&local_660);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_668);
                                                  std::__cxx11::string::~string((string *)local_688)
                                                  ;
                                                  testing::Message::~Message(&local_660);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_650);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_18.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_6a4 = bc_op(gtest_ar_18.message_.ptr_.
                                                                      _4_4_);
                                                    local_6a8 = BC_SET_N;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_6a0,
                                                                       "bc_op(ins)","BC_SET_N",
                                                                       &local_6a4,&local_6a8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6a0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6b0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6a0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_19.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cd,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_19.message_,
                                                             &local_6b0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_19.message_);
                                                  testing::Message::~Message(&local_6b0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6a0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6c9 = bc_arg1(gtest_ar_18.message_.ptr_.
                                                                        _4_4_);
                                                    local_6d0 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_6c8,
                                                               "bc_arg1(ins)","1",&local_6c9,
                                                               &local_6d0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6c8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_6d8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6c8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_20.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cd,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_20.message_,
                                                             &local_6d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_20.message_);
                                                  testing::Message::~Message(&local_6d8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6c8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_6f2 = bc_arg16(gtest_ar_18.message_.ptr_.
                                                                         _4_4_);
                                                    local_6f8 = 2;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,int>
                                                              ((EqHelper<false> *)local_6f0,
                                                               "bc_arg16(ins)","2",&local_6f2,
                                                               &local_6f8);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6f0)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_700);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_6f0);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__8.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cd,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__8.message_,
                                                             &local_700);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__8.message_);
                                                  testing::Message::~Message(&local_700);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6f0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_719 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_718,&local_719
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_718);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_728);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_750,
                                                               (internal *)local_718,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_730,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cf,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_730,&local_728);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_730);
                                                  std::__cxx11::string::~string((string *)local_750)
                                                  ;
                                                  testing::Message::~Message(&local_728);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_718);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_21.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_76c = bc_op(gtest_ar_21.message_.ptr_.
                                                                      _4_4_);
                                                    local_770 = BC_SET_N;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_768,
                                                                       "bc_op(ins)","BC_SET_N",
                                                                       &local_76c,&local_770);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_768)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_778);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_768);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_22.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cf,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_22.message_,
                                                             &local_778);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_22.message_);
                                                  testing::Message::~Message(&local_778);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_768);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_791 = bc_arg1(gtest_ar_21.message_.ptr_.
                                                                        _4_4_);
                                                    local_798 = 1;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_790,
                                                               "bc_arg1(ins)","1",&local_791,
                                                               &local_798);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_790)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7a0);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_790);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_23.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cf,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_23.message_,
                                                             &local_7a0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_23.message_);
                                                  testing::Message::~Message(&local_7a0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_790);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_7ba = bc_arg16(gtest_ar_21.message_.ptr_.
                                                                         _4_4_);
                                                    local_7c0 = 3;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_short,int>
                                                              ((EqHelper<false> *)local_7b8,
                                                               "bc_arg16(ins)","3",&local_7ba,
                                                               &local_7c0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7b8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_7c8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_7b8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar__9.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2cf,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__9.message_,
                                                             &local_7c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__9.message_);
                                                  testing::Message::~Message(&local_7c8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7b8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_7e1 = mock.cur_fn <
                                                                (ulong)(long)*(int *)(mock.vm._8_8_
                                                                                      + 0x10 + mock.
                                                  vm._264_8_ * 0x18);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_7e0,&local_7e1
                                                             ,(type *)0x0);
                                                  bVar1 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7e0);
                                                  if (!bVar1) {
                                                    testing::Message::Message(&local_7f0);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_818,
                                                               (internal *)local_7e0,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  pcVar2 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_7f8,kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2d1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_7f8,&local_7f0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_7f8);
                                                  std::__cxx11::string::~string((string *)local_818)
                                                  ;
                                                  testing::Message::~Message(&local_7f0);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7e0);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar_24.message_.ptr_._4_4_ =
                                                         MockParser::next((MockParser *)
                                                                          &gtest_ar_.message_);
                                                    local_834 = bc_op(gtest_ar_24.message_.ptr_.
                                                                      _4_4_);
                                                    local_838 = BC_RET;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<BcOp,BcOp>((EqHelper<false> *)local_830,
                                                                       "bc_op(ins)","BC_RET",
                                                                       &local_834,&local_838);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_830)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_840);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_830);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_25.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2d1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_840);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_840);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_830);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_859 = bc_arg1(gtest_ar_24.message_.ptr_.
                                                                        _4_4_);
                                                    local_860 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_858,
                                                               "bc_arg1(ins)","0",&local_859,
                                                               &local_860);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_858)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_868);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_858);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_26.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2d1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_26.message_,
                                                             &local_868);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_26.message_);
                                                  testing::Message::~Message(&local_868);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_858);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_881 = bc_arg2(gtest_ar_24.message_.ptr_.
                                                                        _4_4_);
                                                    local_888 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_880,
                                                               "bc_arg2(ins)","0",&local_881,
                                                               &local_888);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_880)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_890);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_880);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                ((AssertHelper *)
                                                                 &gtest_ar_27.message_,kFatalFailure
                                                                 ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2d1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_27.message_,
                                                             &local_890);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_27.message_);
                                                  testing::Message::~Message(&local_890);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_880);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    local_8a9 = bc_arg3(gtest_ar_24.message_.ptr_.
                                                                        _4_4_);
                                                    local_8b0 = 0;
                                                    testing::internal::EqHelper<false>::
                                                    Compare<unsigned_char,int>
                                                              ((EqHelper<false> *)local_8a8,
                                                               "bc_arg3(ins)","0",&local_8a9,
                                                               &local_8b0);
                                                    bVar1 = testing::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8a8)
                                                    ;
                                                    if (!bVar1) {
                                                      testing::Message::Message(&local_8b8);
                                                      pcVar2 = testing::AssertionResult::
                                                               failure_message((AssertionResult *)
                                                                               local_8a8);
                                                      testing::internal::AssertHelper::AssertHelper
                                                                (&local_8c0,kFatalFailure,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x2d1,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_8c0,&local_8b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_8c0);
                                                  testing::Message::~Message(&local_8b8);
                                                  }
                                                  gtest_ar.message_.ptr_._5_3_ = 0;
                                                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8a8);
                                                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                                                    gtest_ar.message_.ptr_._4_4_ = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  MockParser::~MockParser((MockParser *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(If, IfElseif) {
	MockParser mock(
		"let a = 3\n"
		"if a == 3 {\n"
		"  let b = 4\n"
		"} elseif a == 4 {\n"
		"  let b = 5\n"
		"}\n"
		"let c = 6\n"
	);

	INS2(BC_SET_N, 0, 0);

	INS2(BC_NEQ_LN, 0, 0); // If condition
	JMP(3); // Jump to elseif condition
	INS2(BC_SET_N, 1, 1); // If body
	JMP(4); // Jump to after
	INS2(BC_NEQ_LN, 0, 1); // Elseif condition
	JMP(2);
	INS2(BC_SET_N, 1, 2); // Elseif body

	INS2(BC_SET_N, 1, 3); // After

	INS(BC_RET, 0, 0, 0);
}